

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O3

void __thiscall
llama_batch_allocr::llama_batch_allocr(llama_batch_allocr *this,llama_batch in_batch,llama_pos p0)

{
  pointer piVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  (this->seq_id_0)._M_elems[0] = 0;
  (this->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->n_seq_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->n_seq_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->n_seq_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->seq_id).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->seq_id).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->seq_id).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->logits).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->logits).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->logits).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->batch).n_tokens = in_batch.n_tokens;
  *(undefined4 *)&(this->batch).field_0x4 = in_batch._4_4_;
  *(undefined4 *)&(this->batch).token = in_batch.token._0_4_;
  *(undefined4 *)((long)&(this->batch).token + 4) = in_batch.token._4_4_;
  *(undefined4 *)&(this->batch).embd = in_batch.embd._0_4_;
  *(undefined4 *)((long)&(this->batch).embd + 4) = in_batch.embd._4_4_;
  *(undefined4 *)&(this->batch).pos = in_batch.pos._0_4_;
  *(undefined4 *)((long)&(this->batch).pos + 4) = in_batch.pos._4_4_;
  *(undefined4 *)&(this->batch).n_seq_id = in_batch.n_seq_id._0_4_;
  *(undefined4 *)((long)&(this->batch).n_seq_id + 4) = in_batch.n_seq_id._4_4_;
  *(undefined4 *)&(this->batch).seq_id = in_batch.seq_id._0_4_;
  *(undefined4 *)((long)&(this->batch).seq_id + 4) = in_batch.seq_id._4_4_;
  (this->batch).logits = in_batch.logits;
  iVar4 = (this->batch).n_tokens;
  if (0 < (long)iVar4) {
    if ((this->batch).pos == (llama_pos *)0x0) {
      std::vector<int,_std::allocator<int>_>::resize(&this->pos,(long)iVar4);
      iVar4 = (this->batch).n_tokens;
      piVar1 = (this->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < iVar4) {
        lVar3 = 0;
        do {
          piVar1[lVar3] = p0 + (int)lVar3;
          lVar3 = lVar3 + 1;
          iVar4 = (this->batch).n_tokens;
        } while (lVar3 < iVar4);
      }
      (this->batch).pos = piVar1;
    }
    if ((this->batch).n_seq_id == (int32_t *)0x0) {
      std::vector<int,_std::allocator<int>_>::resize(&this->n_seq_id,(long)iVar4);
      iVar4 = (this->batch).n_tokens;
      piVar1 = (this->n_seq_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < iVar4) {
        lVar3 = 0;
        do {
          piVar1[lVar3] = 1;
          lVar3 = lVar3 + 1;
          iVar4 = (this->batch).n_tokens;
        } while (lVar3 < iVar4);
      }
      (this->batch).n_seq_id = piVar1;
    }
    if ((this->batch).seq_id == (llama_seq_id **)0x0) {
      std::vector<int_*,_std::allocator<int_*>_>::resize(&this->seq_id,(long)(iVar4 + 1));
      iVar4 = (this->batch).n_tokens;
      lVar3 = (long)iVar4;
      (this->seq_id).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3] = (int *)0x0;
      if (0 < lVar3) {
        lVar2 = 0;
        do {
          (this->seq_id).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar2] = (this->seq_id_0)._M_elems;
          lVar2 = lVar2 + 1;
        } while (lVar3 != lVar2);
      }
      (this->batch).seq_id =
           (this->seq_id).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    if ((this->batch).logits == (int8_t *)0x0) {
      std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->logits,(long)iVar4);
      (this->logits).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] = '\x01';
      (this->batch).logits =
           (this->logits).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
             ,0x116,"GGML_ASSERT(%s) failed","batch.n_tokens > 0");
}

Assistant:

llama_batch_allocr::llama_batch_allocr(struct llama_batch in_batch, llama_pos p0) {
    batch = in_batch;
    GGML_ASSERT(batch.n_tokens > 0);
    if (!batch.pos) {
        pos.resize(batch.n_tokens);
        for (int32_t i = 0; i < batch.n_tokens; i++) {
            pos[i] = i + p0;
        }
        batch.pos = pos.data();
    }
    if (!batch.n_seq_id) {
        n_seq_id.resize(batch.n_tokens);
        for (int32_t i = 0; i < batch.n_tokens; i++) {
            n_seq_id[i] = seq_id_0.size();
        }
        batch.n_seq_id = n_seq_id.data();
    }
    if (!batch.seq_id) {
        seq_id.resize(batch.n_tokens + 1);
        seq_id[batch.n_tokens] = NULL;
        for (int32_t i = 0; i < batch.n_tokens; i++) {
            seq_id[i] = seq_id_0.data();
        }
        batch.seq_id = seq_id.data();
    }
    if (!batch.logits) {
        logits.resize(batch.n_tokens);
        logits[logits.size() - 1] = true;
        batch.logits = logits.data();
    }
}